

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O0

char * rapidjson::internal::i64toa(int64_t value,char *buffer)

{
  char *pcVar1;
  undefined1 *in_RSI;
  long in_RDI;
  uint64_t u;
  char *in_stack_000000d8;
  uint64_t in_stack_000000e0;
  
  if (in_RDI < 0) {
    *in_RSI = 0x2d;
  }
  pcVar1 = u64toa(in_stack_000000e0,in_stack_000000d8);
  return pcVar1;
}

Assistant:

inline char* i64toa(int64_t value, char* buffer) {
    RAPIDJSON_ASSERT(buffer != 0);
    uint64_t u = static_cast<uint64_t>(value);
    if (value < 0) {
        *buffer++ = '-';
        u = ~u + 1;
    }

    return u64toa(u, buffer);
}